

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsts.c
# Opt level: O2

CURLcode Curl_hsts_loadcb(Curl_easy *data,hsts *h)

{
  CURLSTScode CVar1;
  CURLcode CVar2;
  curl_hstsread_callback p_Var3;
  byte in_CL;
  time_t expires;
  CURLcode CVar4;
  curl_hstsentry local_160;
  char buffer [257];
  
  CVar4 = CURLE_OK;
  if ((h != (hsts *)0x0) && (p_Var3 = (data->set).hsts_read, p_Var3 != (curl_hstsread_callback)0x0))
  {
    CVar4 = CURLE_ABORTED_BY_CALLBACK;
    while( true ) {
      local_160.namelen = 0x100;
      local_160._16_1_ = in_CL & 0xfe;
      local_160.expire[0] = '\0';
      buffer[0] = '\0';
      local_160.name = buffer;
      CVar1 = (*p_Var3)(data,&local_160,(data->set).hsts_read_userp);
      if (CVar1 != CURLSTS_OK) break;
      if (*local_160.name == '\0') {
        return CURLE_BAD_FUNCTION_ARGUMENT;
      }
      expires = 0x7fffffffffffffff;
      if (local_160.expire[0] != '\0') {
        expires = Curl_getdate_capped(local_160.expire);
      }
      CVar2 = hsts_create(h,local_160.name,(_Bool)(local_160._16_1_ & 1),expires);
      if (CVar2 != CURLE_OK) {
        return CVar2;
      }
      p_Var3 = (data->set).hsts_read;
      in_CL = local_160._16_1_;
    }
    if (CVar1 != CURLSTS_FAIL) {
      CVar4 = CURLE_OK;
    }
  }
  return CVar4;
}

Assistant:

CURLcode Curl_hsts_loadcb(struct Curl_easy *data, struct hsts *h)
{
  if(h)
    return hsts_pull(data, h);
  return CURLE_OK;
}